

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O0

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ReserveSpaceForPipelineDesc
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this,
          GraphicsPipelineStateCreateInfo *CreateInfo,FixedLinearAllocator *MemPool)

{
  uint *puVar1;
  uint local_3c;
  undefined8 *local_38;
  LayoutElement *LayoutElem;
  Uint32 i;
  Uint32 BufferSlotsUsed;
  InputLayoutDesc *InputLayout;
  FixedLinearAllocator *MemPool_local;
  GraphicsPipelineStateCreateInfo *CreateInfo_local;
  PipelineStateBase<Diligent::EngineVkImplTraits> *this_local;
  
  InputLayout = (InputLayoutDesc *)MemPool;
  MemPool_local = (FixedLinearAllocator *)CreateInfo;
  CreateInfo_local = (GraphicsPipelineStateCreateInfo *)this;
  FixedLinearAllocator::
  AddSpace<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::GraphicsPipelineData>
            (MemPool,1);
  ReserveResourceLayout
            ((PipelineResourceLayoutDesc *)&MemPool_local->m_CurrAlignment,
             (FixedLinearAllocator *)InputLayout);
  ReserveResourceSignatures
            (this,(PipelineStateCreateInfo *)MemPool_local,(FixedLinearAllocator *)InputLayout);
  _i = &MemPool_local[2].m_DbgAllocations.
        super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (*(int *)&MemPool_local[2].m_DbgUsingExternalMemory != 0) {
    LayoutElem._4_4_ = 0;
    FixedLinearAllocator::AddSpace<Diligent::LayoutElement>
              ((FixedLinearAllocator *)InputLayout,
               (ulong)*(uint *)&MemPool_local[2].m_DbgUsingExternalMemory);
    for (LayoutElem._0_4_ = 0; (uint)LayoutElem < *(uint *)(_i + 1);
        LayoutElem._0_4_ = (uint)LayoutElem + 1) {
      local_38 = (undefined8 *)((long)*_i + (ulong)(uint)LayoutElem * 0x28);
      FixedLinearAllocator::AddSpaceForString
                ((FixedLinearAllocator *)InputLayout,(Char *)*local_38,0);
      local_3c = *(int *)((long)local_38 + 0xc) + 1;
      puVar1 = std::max<unsigned_int>((uint *)((long)&LayoutElem + 4),&local_3c);
      LayoutElem._4_4_ = *puVar1;
    }
    FixedLinearAllocator::AddSpace<unsigned_int>
              ((FixedLinearAllocator *)InputLayout,(ulong)LayoutElem._4_4_);
  }
  return;
}

Assistant:

void ReserveSpaceForPipelineDesc(const GraphicsPipelineStateCreateInfo& CreateInfo,
                                     FixedLinearAllocator&                  MemPool) noexcept
    {
        MemPool.AddSpace<GraphicsPipelineData>();
        ReserveResourceLayout(CreateInfo.PSODesc.ResourceLayout, MemPool);
        ReserveResourceSignatures(CreateInfo, MemPool);

        const InputLayoutDesc& InputLayout = CreateInfo.GraphicsPipeline.InputLayout;
        if (InputLayout.NumElements > 0)
        {
            Uint32 BufferSlotsUsed = 0;
            MemPool.AddSpace<LayoutElement>(InputLayout.NumElements);
            for (Uint32 i = 0; i < InputLayout.NumElements; ++i)
            {
                const LayoutElement& LayoutElem = InputLayout.LayoutElements[i];
                MemPool.AddSpaceForString(LayoutElem.HLSLSemantic);
                BufferSlotsUsed = std::max(BufferSlotsUsed, LayoutElem.BufferSlot + 1);
            }

            MemPool.AddSpace<Uint32>(BufferSlotsUsed);
        }

        static_assert(std::is_trivially_destructible<decltype(*InputLayout.LayoutElements)>::value, "Add destructor for this object to Destruct()");
    }